

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O0

void __thiscall
pstore::
basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
::~basic_rotating_log
          (basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
           *this)

{
  int in_ESI;
  basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
  *this_local;
  
  close(this,in_ESI);
  anon_unknown.dwarf_1ece36::mock_file_system_traits::~mock_file_system_traits
            (&this->file_system_traits_);
  anon_unknown.dwarf_1ece36::mock_string_stream_traits::~mock_string_stream_traits
            (&this->stream_traits_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->stream_);
  std::__cxx11::string::~string((string *)&this->base_name_);
  basic_logger::~basic_logger(&this->super_basic_logger);
  return;
}

Assistant:

basic_rotating_log<StreamTraits, FileSystemTraits>::~basic_rotating_log () noexcept {
        PSTORE_TRY { this->close (); }